

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

_Bool mi_os_decommit_ex(void *addr,size_t size,_Bool *needs_recommit,size_t stat_size)

{
  uint uVar1;
  void *size_00;
  undefined1 *in_RDX;
  int err;
  void *start;
  size_t csize;
  size_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  void *in_stack_ffffffffffffffd0;
  _Bool local_1;
  
  _mi_stat_decrease((mi_stat_count_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                    ,in_stack_ffffffffffffffb8);
  size_00 = mi_os_page_align_area_conservative
                      ((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8,(size_t *)0xb23ef1);
  if (in_stack_ffffffffffffffd0 == (void *)0x0) {
    local_1 = true;
  }
  else {
    *in_RDX = 1;
    uVar1 = _mi_prim_decommit(in_stack_ffffffffffffffd0,(size_t)size_00,
                              (_Bool *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                             );
    if (uVar1 != 0) {
      _mi_warning_message("cannot decommit OS memory (error: %d (0x%x), address: %p, size: 0x%zx bytes)\n"
                          ,(ulong)uVar1,(ulong)uVar1,size_00,in_stack_ffffffffffffffd0);
    }
    local_1 = uVar1 == 0;
  }
  return local_1;
}

Assistant:

static bool mi_os_decommit_ex(void* addr, size_t size, bool* needs_recommit, size_t stat_size) {
  mi_assert_internal(needs_recommit!=NULL);
  mi_os_stat_decrease(committed, stat_size);

  // page align
  size_t csize;
  void* start = mi_os_page_align_area_conservative(addr, size, &csize);
  if (csize == 0) return true;

  // decommit
  *needs_recommit = true;
  int err = _mi_prim_decommit(start,csize,needs_recommit);
  if (err != 0) {
    _mi_warning_message("cannot decommit OS memory (error: %d (0x%x), address: %p, size: 0x%zx bytes)\n", err, err, start, csize);
  }
  mi_assert_internal(err == 0);
  return (err == 0);
}